

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variant.cpp
# Opt level: O2

ostream * __thiscall cali::Variant::write_cali(Variant *this,ostream *os)

{
  char *pcVar1;
  size_t size;
  string local_30;
  
  switch((char)(this->m_v).type_and_size) {
  case '\0':
    break;
  default:
    to_string_abi_cxx11_(&local_30,this);
    util::write_cali_esc_string(os,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    break;
  case '\x02':
    std::ostream::_M_insert<long>((long)os);
    break;
  case '\x03':
    util::write_uint64(os,(this->m_v).value.v_uint);
    break;
  case '\x04':
    pcVar1 = (char *)(this->m_v).value.unmanaged_ptr;
    size = Variant::size(this);
    util::write_cali_esc_string(os,pcVar1,size);
    break;
  case '\x06':
    std::ostream::_M_insert<double>((this->m_v).value.v_double);
    break;
  case '\b':
    pcVar1 = cali_type2string((this->m_v).value.v_type);
    std::operator<<(os,pcVar1);
  }
  return os;
}

Assistant:

std::ostream& Variant::write_cali(std::ostream& os)
{
    cali_attr_type type = this->type();

    switch (type) {
    case CALI_TYPE_INV:
        break;
    case CALI_TYPE_INT:
        os << m_v.value.v_int;
        break;
    case CALI_TYPE_DOUBLE:
        os << m_v.value.v_double;
        break;
    case CALI_TYPE_UINT:
        util::write_uint64(os, m_v.value.v_uint);
        break;
    case CALI_TYPE_STRING:
        util::write_cali_esc_string(os, static_cast<const char*>(m_v.value.unmanaged_const_ptr), size());
        break;
    case CALI_TYPE_TYPE:
        os << cali_type2string(m_v.value.v_type);
        break;
    default:
        util::write_cali_esc_string(os, to_string());
    }

    return os;
}